

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O0

err_t EBML_UniStringSetValue(ebml_string *Element,tchar_t *Value)

{
  bool_t bVar1;
  char local_828 [8];
  char Data [2048];
  tchar_t *Value_local;
  ebml_string *Element_local;
  
  bVar1 = Node_IsPartOf(Element,0x55534245);
  if (bVar1 == 0) {
    Element_local = (ebml_string *)0xfffffffffffffffd;
  }
  else {
    Node_ToUTF8(Element,local_828,0x7ff,Value);
    Data[0x7f7] = '\0';
    Element_local = (ebml_string *)EBML_StringSetValue(Element,local_828);
  }
  return (err_t)Element_local;
}

Assistant:

err_t EBML_UniStringSetValue(ebml_string *Element,const tchar_t *Value)
{
    char Data[2048];
    if (!Node_IsPartOf(Element,EBML_UNISTRING_CLASS))
        return ERR_INVALID_DATA;
    Node_ToUTF8(Element,Data,sizeof(Data)-1,Value);
    Data[sizeof(Data)-1] = 0;
    return EBML_StringSetValue(Element,Data);
}